

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::ensure(JSPrinter *this,int safety)

{
  unsigned_long *puVar1;
  char *pcVar2;
  char *buf;
  unsigned_long local_20;
  int local_14;
  JSPrinter *pJStack_10;
  int safety_local;
  JSPrinter *this_local;
  
  if (this->size < this->used + (long)safety) {
    local_20 = 0x400;
    buf = (char *)(this->size << 1);
    local_14 = safety;
    pJStack_10 = this;
    puVar1 = std::max<unsigned_long>(&local_20,(unsigned_long *)&buf);
    this->size = *puVar1 + (long)local_14;
    if (this->buffer == (char *)0x0) {
      pcVar2 = (char *)malloc(this->size);
      this->buffer = pcVar2;
      if (this->buffer == (char *)0x0) {
        fprintf(_stderr,"Out of memory allocating %zd bytes for output buffer!\n",this->size);
        abort();
      }
    }
    else {
      pcVar2 = (char *)realloc(this->buffer,this->size);
      if (pcVar2 == (char *)0x0) {
        free(this->buffer);
        fprintf(_stderr,"Out of memory allocating %zd bytes for output buffer!\n",this->size);
        abort();
      }
      this->buffer = pcVar2;
    }
  }
  return;
}

Assistant:

void ensure(int safety = 100) {
    if (size >= used + safety) {
      return;
    }
    size = std::max((size_t)1024, size * 2) + safety;
    if (!buffer) {
      buffer = (char*)malloc(size);
      if (!buffer) {
        errv("Out of memory allocating %zd bytes for output buffer!", size);
        abort();
      }
    } else {
      char* buf = (char*)realloc(buffer, size);
      if (!buf) {
        free(buffer);
        errv("Out of memory allocating %zd bytes for output buffer!", size);
        abort();
      }
      buffer = buf;
    }
  }